

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void __thiscall
HTTPRequestTracker::RemoveConnection(HTTPRequestTracker *this,evhttp_connection *conn)

{
  long lVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false> this_00;
  long in_RDI;
  long in_FS_OFFSET;
  iterator it;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  Mutex *in_stack_ffffffffffffff78;
  unordered_map<const_evhttp_connection_*,_unsigned_long,_std::hash<const_evhttp_connection_*>,_std::equal_to<const_evhttp_connection_*>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffff80;
  char *it_00;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffb0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff78);
  it_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp";
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,0,true);
  inline_assertion_check<true,evhttp_connection_const*&>
            ((evhttp_connection **)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(char *)(in_RDI + 0x58),it_00);
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_map<const_evhttp_connection_*,_unsigned_long,_std::hash<const_evhttp_connection_*>,_std::equal_to<const_evhttp_connection_*>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  std::
  unordered_map<const_evhttp_connection_*,_unsigned_long,_std::hash<const_evhttp_connection_*>,_std::equal_to<const_evhttp_connection_*>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>_>
  ::end(in_stack_ffffffffffffff80);
  bVar2 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                      *)this_00._M_cur,
                     (_Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                      *)in_stack_ffffffffffffff80);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    RemoveConnectionInternal((HTTPRequestTracker *)this_00._M_cur,(iterator)it_00);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        auto it{m_tracker.find(Assert(conn))};
        if (it != m_tracker.end()) RemoveConnectionInternal(it);
    }